

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O2

void cpu_ppc_store_tbl_ppc64(CPUPPCState_conflict2 *env,uint32_t value)

{
  ppc_tb_t *ppVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  ppVar1 = env->tb_env;
  uVar5 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  auVar3 = ZEXT416(ppVar1->tb_freq) * auVar3;
  lVar6 = __udivti3(auVar3._0_8_,auVar3._8_8_,1000000000,0);
  lVar2 = ppVar1->tb_offset;
  uVar5 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar5;
  auVar4 = ZEXT416(ppVar1->tb_freq) * auVar4;
  lVar7 = __udivti3(auVar4._0_8_,auVar4._8_8_,1000000000,0);
  ppVar1->tb_offset = ((ulong)value | lVar6 + lVar2 & 0xffffffff00000000U) - lVar7;
  return;
}

Assistant:

void cpu_ppc_store_tbl (CPUPPCState *env, uint32_t value)
{
    ppc_tb_t *tb_env = env->tb_env;
    uint64_t tb;

    tb = cpu_ppc_get_tb(tb_env, qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL), tb_env->tb_offset);
    tb &= 0xFFFFFFFF00000000ULL;
    cpu_ppc_store_tb(tb_env, qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL),
                     &tb_env->tb_offset, tb | (uint64_t)value);
}